

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O1

int __thiscall Clasp::Cli::ClaspAppBase::shutdown(ClaspAppBase *this,int __fd,int __how)

{
  uint uVar1;
  ulong uVar2;
  int in_EAX;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  StringBuilder *this_00;
  char *pcVar5;
  uint uVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar7;
  LemmaLogger *this_01;
  long *plVar8;
  double dVar9;
  StringBuilder SStack_58;
  
  if (1 < (this->clasp_).ptr_) {
    this_01 = (LemmaLogger *)((this->logger_).ptr_ & 0xfffffffffffffffe);
    if (this_01 != (LemmaLogger *)0x0) {
      LemmaLogger::close(this_01,__fd);
      __how = extraout_EDX;
    }
    uVar2 = (this->lemmaIn_).ptr_;
    plVar8 = (long *)(uVar2 & 0xfffffffffffffffe);
    if ((uVar2 & 1) != 0 && plVar8 != (long *)0x0) {
      (this->lemmaIn_).ptr_ = (uintp)plVar8;
      (**(code **)(*plVar8 + 8))();
      __how = extraout_EDX_00;
    }
    (this->lemmaIn_).ptr_ = 1;
    iVar3 = ClaspFacade::shutdown
                      ((ClaspFacade *)((this->clasp_).ptr_ & 0xfffffffffffffffe),__fd,__how);
    if ((shutdownTime_g != 0.0) || (NAN(shutdownTime_g))) {
      dVar9 = RealTime::getTime();
      shutdownTime_g = dVar9 + shutdownTime_g;
      Potassco::StringBuilder::StringBuilder(&SStack_58);
      this_00 = Potassco::StringBuilder::appendFormat
                          (&SStack_58,"Shutdown completed in %.3f seconds",shutdownTime_g);
      pcVar5 = Potassco::StringBuilder::c_str(this_00);
      (*(this->super_Application)._vptr_Application[7])(this,pcVar5);
      Potassco::StringBuilder::~StringBuilder(&SStack_58);
    }
    plVar8 = (long *)((this->out_).ptr_ & 0xfffffffffffffffe);
    if (plVar8 != (long *)0x0) {
      (**(code **)(*plVar8 + 0x30))(plVar8,CONCAT44(extraout_var,iVar3));
    }
    uVar4 = Potassco::Application::getExitCode(&this->super_Application);
    uVar1 = *(uint *)(CONCAT44(extraout_var,iVar3) + 0x44);
    uVar6 = 10;
    if (((byte)uVar1 & 3) != 1) {
      uVar6 = 0;
    }
    uVar7 = uVar6 + 0x14;
    if ((uVar1 & 4) == 0) {
      uVar7 = uVar6;
    }
    Potassco::Application::setExitCode(&this->super_Application,uVar1 >> 3 & 1 | uVar4 | uVar7);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void ClaspAppBase::shutdown() {
	if (!clasp_.get()) { return; }
	if (logger_.get()) { logger_->close(); }
	lemmaIn_ = 0;
	const ClaspFacade::Summary& result = clasp_->shutdown();
	if (shutdownTime_g) {
		shutdownTime_g += RealTime::getTime();
		info(POTASSCO_FORMAT("Shutdown completed in %.3f seconds", shutdownTime_g));
	}
	if (out_.get())  { out_->shutdown(result); }
	setExitCode(getExitCode() | exitCode(result));
	if (setFpuMode()){ fpuReset(fpuMode_); }
}